

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O0

void tab_to_next_widget_proc(Am_Object *cmd)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value local_f8;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Value local_d8;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_String local_b8;
  Am_String cur_cur_value;
  Am_String old_cur_value;
  Am_Object cur_text;
  Am_Object cur_inter;
  Am_Value_List local_90;
  Am_Input_Char local_7c;
  Am_Input_Char ic;
  undefined1 local_68 [8];
  Am_Value v;
  undefined1 local_50 [6];
  bool running;
  bool forward;
  Am_Object next_widget;
  Am_Object cur_widget;
  Am_Object last_widget;
  Am_Value_List all_text_widgets;
  Am_Object local_18;
  Am_Object inter;
  Am_Object *cmd_local;
  
  inter.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)cmd);
  bVar1 = Am_Object::Valid(&local_18);
  if (!bVar1) goto LAB_0034cc55;
  pAVar3 = Am_Object::Get(&local_18,0x1a9,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&last_widget,pAVar3);
  Am_Object::Am_Object(&cur_widget);
  Am_Object::Am_Object(&next_widget);
  Am_Object::Am_Object((Am_Object *)local_50);
  v.value.long_value._6_1_ = 0;
  Am_Value::Am_Value((Am_Value *)local_68);
  bVar1 = Am_Value_List::Empty((Am_Value_List *)&last_widget);
  if (!bVar1) {
    pAVar3 = Am_Object::Peek(cmd,0x1d8,0);
    Am_Value::operator=((Am_Value *)local_68,pAVar3);
    bVar1 = Am_Value::Valid((Am_Value *)local_68);
    if (bVar1) {
      Am_Object::operator=(&cur_widget,(Am_Value *)local_68);
    }
    Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffff88,(Am_Slot_Flags)cmd);
    Am_Object::operator=(&local_18,(Am_Object *)&stack0xffffffffffffff88);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff88);
    pAVar3 = Am_Object::Get(&local_18,0x11b,0);
    Am_Input_Char::Am_Input_Char(&local_7c,pAVar3);
    v.value.long_value._7_1_ = ~local_7c._2_1_ & 1;
    Am_Value_List::Start((Am_Value_List *)&last_widget);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&last_widget), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&last_widget);
      Am_Object::operator=(&next_widget,pAVar3);
      Am_Object::Get_Object((Am_Object *)&local_90.item,(Am_Slot_Key)&next_widget,0x1ac);
      Am_Object::operator=(&local_18,(Am_Object *)&local_90.item);
      Am_Object::~Am_Object((Am_Object *)&local_90.item);
      pAVar3 = Am_Object::Peek(&local_18,0x123,0);
      Am_Value::operator=((Am_Value *)local_68,pAVar3);
      bVar1 = Am_Value::Valid((Am_Value *)local_68);
      if ((bVar1) && (iVar2 = Am_Value::operator_cast_to_int((Am_Value *)local_68), iVar2 == 1)) {
        v.value.long_value._6_1_ = 1;
        get_next_from(&local_90,SUB81(&last_widget,0));
        Am_Object::operator=((Am_Object *)local_50,(Am_Object *)&local_90);
        Am_Object::~Am_Object((Am_Object *)&local_90);
        break;
      }
      Am_Value_List::Next((Am_Value_List *)&last_widget);
    }
    bVar1 = Am_Object::Valid((Am_Object *)local_50);
    if (!bVar1) {
      bVar1 = Am_Object::Valid(&cur_widget);
      if (bVar1) {
        Am_Value_List::Start((Am_Value_List *)&last_widget);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&cur_widget);
        bVar1 = Am_Value_List::Member((Am_Value_List *)&last_widget,pAVar4);
        if (bVar1) {
          get_next_from((Am_Value_List *)&cur_inter,SUB81(&last_widget,0));
          Am_Object::operator=((Am_Object *)local_50,&cur_inter);
          Am_Object::~Am_Object(&cur_inter);
        }
      }
      bVar1 = Am_Object::Valid((Am_Object *)local_50);
      if (!bVar1) {
        Am_Value_List::Start((Am_Value_List *)&last_widget);
        pAVar3 = Am_Value_List::Get((Am_Value_List *)&last_widget);
        Am_Object::operator=((Am_Object *)local_50,pAVar3);
      }
    }
    if ((v.value.long_value._6_1_ & 1) != 0) {
      Am_Object::Get_Object(&cur_text,(Am_Slot_Key)&next_widget,0x1ac);
      Am_Object::Get_Object((Am_Object *)&old_cur_value,(Am_Slot_Key)&next_widget,0x1d7);
      bVar1 = check_value_legal((Am_Object *)&old_cur_value,&cur_text);
      if (bVar1) {
        pAVar3 = Am_Object::Get(&cur_text,0x16c,0);
        Am_String::Am_String(&cur_cur_value,pAVar3);
        pAVar3 = Am_Object::Get((Am_Object *)&old_cur_value,0xab,0);
        Am_String::Am_String(&local_b8,pAVar3);
        bVar1 = Am_String::operator==(&cur_cur_value,&local_b8);
        if (bVar1) {
          Am_Object::Am_Object(&local_c0,&local_18);
          Am_Abort_Interactor(&local_c0,true);
          Am_Object::~Am_Object(&local_c0);
        }
        else {
          Am_Object::Am_Object(&local_c8,&next_widget);
          Am_Value::Am_Value(&local_d8,&Am_No_Value);
          Am_Stop_Widget(&local_c8,&local_d8);
          Am_Value::~Am_Value(&local_d8);
          Am_Object::~Am_Object(&local_c8);
        }
        Am_Object::Set(&next_widget,0x17c,false,0);
        Am_String::~Am_String(&local_b8);
        Am_String::~Am_String(&cur_cur_value);
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
      Am_Object::~Am_Object((Am_Object *)&old_cur_value);
      Am_Object::~Am_Object(&cur_text);
      if (bVar1) goto LAB_0034cbe7;
    }
    bVar1 = Am_Object::Valid(&cur_widget);
    if (bVar1) {
      Am_Object::Set(&cur_widget,0x17c,false,0);
    }
    bVar1 = Am_Object::Valid((Am_Object *)local_50);
    if (bVar1) {
      find_next_active_widget(&local_e0,(Am_Value_List *)local_50);
      Am_Object::operator=((Am_Object *)local_50,&local_e0);
      Am_Object::~Am_Object(&local_e0);
      bVar1 = Am_Object::Valid((Am_Object *)local_50);
      if (bVar1) {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)local_50);
        Am_Object::Set(cmd,0x1d8,pAVar4,1);
        Am_Object::Set((Am_Object *)local_50,0x17c,true,0);
        Am_Object::Am_Object(&local_e8,(Am_Object *)local_50);
        Am_Value::Am_Value(&local_f8,&Am_No_Value);
        Am_Start_Widget(&local_e8,&local_f8);
        Am_Value::~Am_Value(&local_f8);
        Am_Object::~Am_Object(&local_e8);
      }
    }
  }
LAB_0034cbe7:
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Object::~Am_Object((Am_Object *)local_50);
  Am_Object::~Am_Object(&next_widget);
  Am_Object::~Am_Object(&cur_widget);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&last_widget);
LAB_0034cc55:
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, tab_to_next_widget, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  if (inter.Valid()) {
    Am_Value_List all_text_widgets = inter.Get(Am_LIST_OF_TEXT_WIDGETS);
    Am_Object last_widget, cur_widget, next_widget;
    bool forward;
    bool running = false;
    Am_Value v;
    if (all_text_widgets.Empty())
      return; //nothing to do
    v = cmd.Peek(Am_LAST_TEXT_WIDGET);
    if (v.Valid())
      last_widget = v;
    // see if going forward or backwards
    inter = cmd.Get_Owner();
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    //go forward if not shifted
    forward = !ic.shift;
    // search to see which part is active, if any
    for (all_text_widgets.Start(); !all_text_widgets.Last();
         all_text_widgets.Next()) {
      cur_widget = all_text_widgets.Get();
      inter = cur_widget.Get_Object(Am_INTERACTOR);
      v = inter.Peek(Am_CURRENT_STATE);
      if (v.Valid() && (int)v == 1) { //then this is it
        running = true;
        next_widget = get_next_from(all_text_widgets, forward);
        break;
      }
    }
    if (!next_widget.Valid()) {
      //nothing running, see if have current
      if (last_widget.Valid()) {
        all_text_widgets.Start();
        if (all_text_widgets.Member(last_widget)) {
          next_widget = get_next_from(all_text_widgets, forward);
        }
      }
      if (!next_widget.Valid()) // just use first in the list
      {
        all_text_widgets.Start();
        next_widget = all_text_widgets.Get();
      }
    }
    if (running) {
      //check to see whether current value is legal and if not, don't go on
      Am_Object cur_inter = cur_widget.Get_Object(Am_INTERACTOR);
      Am_Object cur_text = cur_widget.Get_Object(Am_TEXT_WIDGET_TEXT_OBJ);
      if (!check_value_legal(cur_text, cur_inter))
        return;
      //check if old value same as current, in which case, abort so
      //command not queued for undo
      Am_String old_cur_value = cur_inter.Get(Am_OLD_VALUE);
      Am_String cur_cur_value = cur_text.Get(Am_TEXT);
      if (old_cur_value == cur_cur_value)
        Am_Abort_Interactor(inter);
      else
        Am_Stop_Widget(cur_widget);

      cur_widget.Set(Am_KEY_SELECTED, false);
    }
    if (last_widget.Valid())
      last_widget.Set(Am_KEY_SELECTED, false);

    if (next_widget.Valid()) {
      next_widget = find_next_active_widget(next_widget, all_text_widgets);
      if (next_widget.Valid()) {
        cmd.Set(Am_LAST_TEXT_WIDGET, next_widget, Am_OK_IF_NOT_THERE);
        next_widget.Set(Am_KEY_SELECTED, true);
        Am_Start_Widget(next_widget);
      }
    }
  }
}